

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t suov16(CPUTriCoreState *env,int32_t hw0,int32_t hw1)

{
  int32_t iVar1;
  uint uVar2;
  uint uVar3;
  
  env->PSW_USB_V = 0;
  uVar3 = 0xffff;
  if ((0xffff < hw0) || (uVar3 = 0, uVar2 = hw0, hw0 < 0)) {
    uVar2 = uVar3;
    env->PSW_USB_V = 0x80000000;
    uVar3 = 0x80000000;
  }
  iVar1 = 0xffff;
  if (hw1 < 0x10000) {
    iVar1 = hw1;
    if (-1 < hw1) goto LAB_00b38031;
    iVar1 = 0;
  }
  env->PSW_USB_V = 0x80000000;
  uVar3 = 0x80000000;
LAB_00b38031:
  env->PSW_USB_SV = env->PSW_USB_SV | uVar3;
  uVar3 = (hw0 * 2 ^ hw0 | hw1 * 2 ^ hw1) << 0x10;
  env->PSW_USB_AV = uVar3;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar3;
  return iVar1 * 0x10000 + uVar2;
}

Assistant:

static uint32_t suov16(CPUTriCoreState *env, int32_t hw0, int32_t hw1)
{
    int32_t max_pos = UINT16_MAX;
    int32_t av0, av1;

    env->PSW_USB_V = 0;
    av0 = hw0 ^ hw0 * 2u;
    if (hw0 > max_pos) {
        env->PSW_USB_V = (1 << 31);
        hw0 = max_pos;
    } else if (hw0 < 0) {
        env->PSW_USB_V = (1 << 31);
        hw0 = 0;
    }

    av1 = hw1 ^ hw1 * 2u;
    if (hw1 > max_pos) {
        env->PSW_USB_V = (1 << 31);
        hw1 = max_pos;
    } else if (hw1 < 0) {
        env->PSW_USB_V = (1 << 31);
        hw1 = 0;
    }

    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = (av0 | av1) << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    return (hw0 & 0xffff) | (hw1 << 16);
}